

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrmatrix.cpp
# Opt level: O1

void __thiscall
TPZDohrMatrix<double,_TPZDohrSubstructCondense<double>_>::Initialize
          (TPZDohrMatrix<double,_TPZDohrSubstructCondense<double>_> *this)

{
  SubsList *pSVar1;
  ulong uVar2;
  ostream *poVar3;
  _List_node_base *p_Var4;
  int iVar5;
  TPZFMatrix<double> diag;
  char local_171;
  _func_int **local_170;
  _func_int **local_168;
  TPZDohrMatrix<double,_TPZDohrSubstructCondense<double>_> *local_160;
  _func_int **local_158;
  TPZFMatrix<double> local_150;
  TPZFMatrix<double> local_c0;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Number of substructures ",0x18);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  tempo.fNumSub =
       (int)(this->fGlobal).
            super__List_base<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
            ._M_impl._M_node._M_size;
  uVar2 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_158 = (_func_int **)&PTR__TPZFMatrix_0183c898;
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183c898;
  local_c0.fElem = (double *)0x0;
  local_c0.fGiven = (double *)0x0;
  local_c0.fSize = 0;
  local_160 = this;
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = uVar2;
  TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
  local_168 = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
  local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_170 = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_c0.fWork.fStore = (double *)0x0;
  local_c0.fWork.fNElements = 0;
  local_c0.fWork.fNAlloc = 0;
  if (uVar2 != 0) {
    local_c0.fElem = (double *)operator_new__(-(ulong)(uVar2 >> 0x3d != 0) | uVar2 * 8);
    if (0 < (long)uVar2) {
      memset(local_c0.fElem,0,uVar2 * 8);
    }
  }
  pSVar1 = &local_160->fGlobal;
  p_Var4 = (pSVar1->
           super__List_base<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var4 != (_List_node_base *)pSVar1) {
    iVar5 = 0;
    do {
      local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
      local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
      local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           local_158;
      local_150.fElem = (double *)0x0;
      local_150.fGiven = (double *)0x0;
      local_150.fSize = 0;
      TPZVec<int>::TPZVec(&local_150.fPivot.super_TPZVec<int>,0);
      local_150.fPivot.super_TPZVec<int>._vptr_TPZVec = local_168;
      local_150.fPivot.super_TPZVec<int>.fStore = local_150.fPivot.fExtAlloc;
      local_150.fPivot.super_TPZVec<int>.fNElements = 0;
      local_150.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_150.fWork._vptr_TPZVec = local_170;
      local_150.fWork.fStore = (double *)0x0;
      local_150.fWork.fNElements = 0;
      local_150.fWork.fNAlloc = 0;
      TPZDohrSubstructCondense<double>::ContributeDiagonalLocal
                ((TPZDohrSubstructCondense<double> *)(p_Var4[1]._M_next)->_M_next,&local_150);
      TPZDohrAssembly<double>::Assemble
                (((local_160->fAssembly).fRef)->fPointer,iVar5,&local_150,&local_c0);
      local_171 = '*';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_171,1);
      std::ostream::flush();
      TPZFMatrix<double>::~TPZFMatrix(&local_150);
      iVar5 = iVar5 + 1;
      p_Var4 = p_Var4->_M_next;
    } while (p_Var4 != (_List_node_base *)pSVar1);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  p_Var4 = (pSVar1->
           super__List_base<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var4 != (_List_node_base *)pSVar1) {
    iVar5 = 0;
    do {
      local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
      local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
      local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           local_158;
      local_150.fElem = (double *)0x0;
      local_150.fGiven = (double *)0x0;
      local_150.fSize = 0;
      TPZVec<int>::TPZVec(&local_150.fPivot.super_TPZVec<int>,0);
      local_150.fPivot.super_TPZVec<int>._vptr_TPZVec = local_168;
      local_150.fPivot.super_TPZVec<int>.fStore = local_150.fPivot.fExtAlloc;
      local_150.fPivot.super_TPZVec<int>.fNElements = 0;
      local_150.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_150.fWork._vptr_TPZVec = local_170;
      local_150.fWork.fStore = (double *)0x0;
      local_150.fWork.fNElements = 0;
      local_150.fWork.fNAlloc = 0;
      TPZDohrAssembly<double>::Extract
                (((local_160->fAssembly).fRef)->fPointer,iVar5,&local_c0,&local_150);
      TPZDohrSubstructCondense<double>::ComputeWeightsLocal
                ((TPZDohrSubstructCondense<double> *)(p_Var4[1]._M_next)->_M_next,&local_150);
      TPZFMatrix<double>::~TPZFMatrix(&local_150);
      iVar5 = iVar5 + 1;
      p_Var4 = p_Var4->_M_next;
    } while (p_Var4 != (_List_node_base *)pSVar1);
  }
  TPZFMatrix<double>::~TPZFMatrix(&local_c0);
  return;
}

Assistant:

void TPZDohrMatrix<TVar,TSubStruct>::Initialize() 
{
	std::cout << "Number of substructures " << fGlobal.size() << std::endl;
	tempo.fNumSub = fGlobal.size();																// alimenta timeTemp com o numero de substruturas
	TPZFMatrix<TVar> diag(this->Rows(),1,0.);
	typename SubsList::iterator iter;
	int isub = 0;
	for (iter=fGlobal.begin();iter!=fGlobal.end();iter++,isub++) {
        //Basic initialization for each substructure (compute the matrices)
        //(*iter)->Initialize();
		TPZFMatrix<TVar> diaglocal;
        (*iter)->ContributeDiagonalLocal(diaglocal);
#ifdef PZ_LOG
        if(logger.isDebugEnabled())
        {
            LOGPZ_DEBUG(logger,"Before assemble diagonal")
        }
#endif
		this->fAssembly->Assemble(isub,diaglocal,diag);
#ifdef PZ_LOG
        if(logger.isDebugEnabled())
		{
			std::stringstream sout;
			sout << "Substructure " << isub << " ";
			diag.Print("Global Diagonal matrix",sout);
			LOGPZ_DEBUG(logger,sout.str())
		}
#endif
        std::cout << '*';
        std::cout.flush();
	}
#ifdef PZ_LOG
    if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		diag.Print("Global Diagonal matrix",sout);
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	std::cout << std::endl;
	for (iter=fGlobal.begin(),isub=0;iter!=fGlobal.end();iter++,isub++) {
        //Computes the Weights for each substructure
		TPZFMatrix<TVar> diaglocal;
		this->fAssembly->Extract(isub,diag,diaglocal);
        (*iter)->ComputeWeightsLocal(diaglocal);
		
	}
}